

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O0

Mat_<double> * cvlfilter_zi(Mat_<double> *__return_storage_ptr__,Mat_<double> *b,Mat_<double> *a)

{
  ostream *this;
  double *pdVar1;
  int local_684;
  _OutputArray local_650;
  Mat_<float> local_638 [3];
  _InputArray local_4d8;
  _InputArray local_4c0;
  _OutputArray local_4a8;
  Mat_<float> local_490 [3];
  _InputArray local_330;
  _InputArray local_318;
  int local_2fc;
  int local_2f8;
  int n;
  int len_b;
  int len_a;
  Mat local_180 [352];
  Mat_<double> *local_20;
  Mat_<double> *a_local;
  Mat_<double> *b_local;
  
  local_20 = a;
  a_local = b;
  b_local = __return_storage_ptr__;
  if ((*(int *)&b->field_0x8 != 1) || (*(int *)&a->field_0x8 != 1)) {
    this = std::operator<<((ostream *)&std::cout,"Numerator b and Denominator a must be 1-D.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  pdVar1 = cv::Mat_<double>::operator()(a,0,0);
  if ((*pdVar1 != 1.0) || (NAN(*pdVar1))) {
    pdVar1 = cv::Mat_<double>::operator()(a,0,0);
    cv::operator/(local_180,*pdVar1);
    cv::Mat_<double>::operator=(b,(MatExpr *)local_180);
    cv::MatExpr::~MatExpr((MatExpr *)local_180);
    pdVar1 = cv::Mat_<double>::operator()(a,0,0);
    cv::operator/((Mat *)&len_b,*pdVar1);
    cv::Mat_<double>::operator=(a,(MatExpr *)&len_b);
    cv::MatExpr::~MatExpr((MatExpr *)&len_b);
  }
  n = *(int *)&a->field_0xc * *(int *)&a->field_0x8;
  local_2f8 = *(int *)&b->field_0xc * *(int *)&b->field_0x8;
  local_684 = local_2f8;
  if (local_2f8 < n) {
    local_684 = n;
  }
  local_2fc = local_684;
  if (n < local_684) {
    cv::_InputArray::_InputArray<double>(&local_318,a);
    cv::Mat_<float>::zeros(local_490,1,local_2fc - n);
    cv::_InputArray::_InputArray(&local_330,(MatExpr *)local_490);
    cv::_OutputArray::_OutputArray<double>(&local_4a8,a);
    cv::hconcat(&local_318,&local_330,&local_4a8);
    cv::_OutputArray::~_OutputArray(&local_4a8);
    cv::_InputArray::~_InputArray(&local_330);
    cv::MatExpr::~MatExpr((MatExpr *)local_490);
    cv::_InputArray::~_InputArray(&local_318);
  }
  else if (local_2f8 < local_684) {
    cv::_InputArray::_InputArray<double>(&local_4c0,b);
    cv::Mat_<float>::zeros(local_638,1,local_2fc - local_2f8);
    cv::_InputArray::_InputArray(&local_4d8,(MatExpr *)local_638);
    cv::_OutputArray::_OutputArray<double>(&local_650,b);
    cv::hconcat(&local_4c0,&local_4d8,&local_650);
    cv::_OutputArray::~_OutputArray(&local_650);
    cv::_InputArray::~_InputArray(&local_4d8);
    cv::MatExpr::~MatExpr((MatExpr *)local_638);
    cv::_InputArray::~_InputArray(&local_4c0);
  }
  cv::Mat_<double>::Mat_(__return_storage_ptr__,0,0);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> cvlfilter_zi(cv::Mat_<double> b, cv::Mat_<double> a) {
    if ((b.rows != 1) || (a.rows != 1)) {
        std::cout << "Numerator b and Denominator a must be 1-D." << std::endl;
    }
    if (a(0, 0) != 1) {
        // Normalize the coefficients so a[0] == 1.
        b = b / a(0, 0);
        a = a / a(0, 0);
    }
    int len_a = a.cols * a.rows;
    int len_b = b.cols * b.rows;
    int n = len_a > len_b ? len_a : len_b;
    if (len_a < n) {
        cv::hconcat(a, cv::Mat_<float>::zeros(1, n - len_a), a);
    } else if (len_b < n) {
        cv::hconcat(b, cv::Mat_<float>::zeros(1, n - len_b), b);
    }
    return cv::Mat_<double>(0, 0);
}